

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Storyboard.cpp
# Opt level: O0

Storyboard * __thiscall ApprovalTests::Storyboard::addFrame(Storyboard *this,string *frame)

{
  long in_RDI;
  string *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string *in_stack_ffffffffffffff58;
  Storyboard *in_stack_ffffffffffffff60;
  Storyboard *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70 [12];
  int in_stack_ffffffffffffff9c;
  undefined1 local_39 [49];
  Storyboard *local_8;
  
  if (*(int *)(in_RDI + 0x188) == 0) {
    this_00 = (Storyboard *)local_39;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)(local_39 + 1),"Initial Frame",(allocator *)this_00);
    local_8 = addFrame(this_00,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    ::std::__cxx11::string::~string((string *)(local_39 + 1));
    ::std::allocator<char>::~allocator((allocator<char> *)local_39);
  }
  else {
    __rhs = &local_90;
    ::std::__cxx11::to_string(in_stack_ffffffffffffff9c);
    ::std::operator+((char *)in_stack_ffffffffffffff58,__rhs);
    local_8 = addFrame(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,__rhs);
    ::std::__cxx11::string::~string(local_70);
    ::std::__cxx11::string::~string((string *)&local_90);
  }
  return local_8;
}

Assistant:

Storyboard& Storyboard::addFrame(const std::string& frame)
    {
        if (frameCount_ == 0)
        {
            return addFrame("Initial Frame", frame);
        }
        else
        {
            return addFrame("Frame #" + std::to_string(frameCount_), frame);
        }
    }